

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.hpp
# Opt level: O1

void __thiscall
actorpp::ActorThread<actorpp::RecvThread>::~ActorThread(ActorThread<actorpp::RecvThread> *this)

{
  int in_ESI;
  
  RecvThread::exit(&this->super_RecvThread,in_ESI);
  std::thread::join();
  if ((this->thread)._M_id._M_thread == 0) {
    RecvThread::~RecvThread(&this->super_RecvThread);
    return;
  }
  std::terminate();
}

Assistant:

~ActorThread() {
    this->exit();
    thread.join();
  }